

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageDataOperations.h
# Opt level: O2

void __thiscall
fe::operations::op_blend_subtract::operator()
          (op_blend_subtract *this,PixelB8G8R8A8 *srcPixelFormat,PixelDISTANCE *destPixelFormat,
          uchar *srcData,uchar *destData,int x,int y)

{
  byte bVar1;
  int iVar2;
  Pixel local_1c;
  
  bVar1 = srcData[3];
  PixelDISTANCE::getPixel(destPixelFormat,destData,&local_1c,x,y);
  iVar2 = 0;
  if (0 < (int)((uint)local_1c.field_0.field_0.bytes[3] - (uint)bVar1)) {
    iVar2 = (uint)local_1c.field_0.field_0.bytes[3] - (uint)bVar1;
  }
  *destData = (uchar)iVar2;
  return;
}

Assistant:

void operator()(const Src& srcPixelFormat, Dest& destPixelFormat, const unsigned char* srcData, unsigned char* destData, OPERATOR_ARGS) const
            {
                Pixel pS;
                srcPixelFormat.getPixel(srcData, pS, OPERATOR_ARGS_PASS);

                Pixel pD;
                destPixelFormat.getPixel(destData, pD, OPERATOR_ARGS_PASS);

                float k = pS.a / float(pD.a);
                pD.r = std::max(0, int(pD.r - pD.r * k));
                pD.g = std::max(0, int(pD.g - pD.g * k));
                pD.b = std::max(0, int(pD.b - pD.b * k));
                pD.a = std::max(0, int(pD.a - pS.a));

                destPixelFormat.setPixel(destData, pD);
            }